

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

void Am_Standard_Open_From_Filename(Am_Object *command_obj,Am_String *filename)

{
  bool bVar1;
  char *pcVar2;
  Am_Value_List *pAVar3;
  Am_Value *value;
  ostream *poVar4;
  Am_Value contents;
  Am_Value_List loaded;
  Am_Handle_Loaded_Items_Method method;
  ifstream in_file;
  Am_Value_List local_280;
  Am_Object local_270;
  Am_Value_List local_268;
  Am_String local_258;
  Am_Value_List local_250;
  Am_Value_List local_240;
  Am_Handle_Loaded_Items_Method local_230;
  Am_String local_220 [4];
  byte abStack_200 [488];
  
  Am_String::Am_String(&local_258,filename);
  remove_extra_quotes(local_220);
  Am_String::operator=(filename,local_220);
  Am_String::~Am_String(local_220);
  Am_String::~Am_String(&local_258);
  set_default_filename(command_obj,filename);
  pcVar2 = Am_String::operator_cast_to_char_(filename);
  std::ifstream::ifstream(local_220,pcVar2,_S_in);
  if ((abStack_200
       [(long)local_220[0].data[-1].super_Am_Wrapper.super_Am_Registered_Type.
              _vptr_Am_Registered_Type] & 5) != 0) {
    Am_Value_List::Am_Value_List(&local_280);
    pAVar3 = Am_Value_List::Add(&local_280,"File could not be opened:",Am_TAIL,true);
    pAVar3 = Am_Value_List::Add(pAVar3,filename,Am_TAIL,true);
    Am_Value_List::Am_Value_List(&local_240,pAVar3);
    Am_Show_Alert_Dialog(&local_240,-10000,-10000,true);
    Am_Value_List::~Am_Value_List(&local_240);
    Am_Value_List::~Am_Value_List(&local_280);
    goto LAB_002417f1;
  }
  Am_Load_Save_Context::Reset(&Am_Default_Load_Save_Context);
  Am_Load_Save_Context::Load
            ((Am_Load_Save_Context *)&local_280,(istream *)&Am_Default_Load_Save_Context);
  bVar1 = Am_Value::Valid((Am_Value *)&local_280);
  if (bVar1) {
    bVar1 = Am_Value_List::Test((Am_Value *)&local_280);
    if (!bVar1) goto LAB_00241773;
    Am_Value_List::Am_Value_List(&local_268,(Am_Value *)&local_280);
    value = Am_Object::Get(command_obj,0x19b,0);
    Am_Handle_Loaded_Items_Method::Am_Handle_Loaded_Items_Method(&local_230,value);
    if (local_230.Call == (Am_Handle_Loaded_Items_Method_Type *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Open Command ",0xd);
      poVar4 = operator<<((ostream *)&std::cerr,command_obj);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," must have a method in Am_HANDLE_OPEN_SAVE_METHOD slot",0x36);
      std::endl<char,std::char_traits<char>>(poVar4);
      Am_Error();
    }
    Am_Object::Am_Object(&local_270,command_obj);
    (*local_230.Call)((Am_Object_Data *)&local_270,&local_268);
    Am_Object::~Am_Object(&local_270);
  }
  else {
LAB_00241773:
    Am_Value_List::Am_Value_List(&local_268);
    pAVar3 = Am_Value_List::Add(&local_268,"File does not contain valid data:",Am_TAIL,true);
    pAVar3 = Am_Value_List::Add(pAVar3,filename,Am_TAIL,true);
    Am_Value_List::Am_Value_List(&local_250,pAVar3);
    Am_Show_Alert_Dialog(&local_250,-10000,-10000,true);
    Am_Value_List::~Am_Value_List(&local_250);
  }
  Am_Value_List::~Am_Value_List(&local_268);
  Am_Value::~Am_Value((Am_Value *)&local_280);
LAB_002417f1:
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void
Am_Standard_Open_From_Filename(Am_Object command_obj, Am_String filename)
{
  filename = remove_extra_quotes(filename);
  set_default_filename(command_obj, filename);
  std::ifstream in_file((const char *)filename, std::ios::in);
  if (!in_file) {
    Am_Show_Alert_Dialog(
        Am_Value_List().Add("File could not be opened:").Add(filename));
    return;
  }
  Am_Default_Load_Save_Context.Reset();
  Am_Value contents = Am_Default_Load_Save_Context.Load(in_file);
  if (!contents.Valid() || !Am_Value_List::Test(contents)) {
    Am_Show_Alert_Dialog(
        Am_Value_List().Add("File does not contain valid data:").Add(filename));
    return;
  }
  Am_Value_List loaded = contents;
  Am_Handle_Loaded_Items_Method method =
      command_obj.Get(Am_HANDLE_OPEN_SAVE_METHOD);
  if (method.Valid())
    method.Call(command_obj, loaded);
  else
    Am_ERRORO("Open Command "
                  << command_obj
                  << " must have a method in Am_HANDLE_OPEN_SAVE_METHOD slot",
              command_obj, Am_HANDLE_OPEN_SAVE_METHOD);
}